

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VMake_Serial(sunindextype length,realtype *v_data,SUNContext sunctx)

{
  SUNContext in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  N_Vector v;
  N_Vector local_8;
  
  local_8 = N_VNewEmpty_Serial((sunindextype)((ulong)in_RSI >> 0x20),in_RDX);
  if (local_8 == (N_Vector)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else if (0 < in_EDI) {
    *(undefined4 *)((long)local_8->content + 4) = 0;
    *(undefined8 *)((long)local_8->content + 8) = in_RSI;
  }
  return local_8;
}

Assistant:

N_Vector N_VMake_Serial(sunindextype length, realtype *v_data, SUNContext sunctx)
{
  N_Vector v;

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  if (v == NULL) return(NULL);

  if (length > 0) {
    /* Attach data */
    NV_OWN_DATA_S(v) = SUNFALSE;
    NV_DATA_S(v)     = v_data;
  }

  return(v);
}